

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_ManReadRange(Prs_Man_t *p)

{
  int iVar1;
  int iVar2;
  int local_20;
  int Right;
  int Left;
  Prs_Man_t *p_local;
  
  iVar1 = Prs_ManIsChar(p,'[');
  if (iVar1 == 0) {
    __assert_fail("Prs_ManIsChar(p, \'[\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                  ,0x20b,"int Prs_ManReadRange(Prs_Man_t *)");
  }
  p->pCur = p->pCur + 1;
  iVar1 = Prs_ManUtilSkipSpaces(p);
  if (iVar1 == 0) {
    iVar1 = Prs_ManIsDigit(p);
    if (iVar1 == 0) {
      p_local._4_4_ = Prs_ManErrorSet(p,"Cannot read digit in range specification.",0);
    }
    else {
      iVar1 = atoi(p->pCur);
      while (iVar2 = Prs_ManIsDigit(p), iVar2 != 0) {
        p->pCur = p->pCur + 1;
      }
      iVar2 = Prs_ManUtilSkipSpaces(p);
      if (iVar2 == 0) {
        iVar2 = Prs_ManIsChar(p,':');
        local_20 = iVar1;
        if (iVar2 != 0) {
          p->pCur = p->pCur + 1;
          iVar2 = Prs_ManUtilSkipSpaces(p);
          if (iVar2 != 0) {
            iVar1 = Prs_ManErrorSet(p,"Error number 5.",0);
            return iVar1;
          }
          iVar2 = Prs_ManIsDigit(p);
          if (iVar2 == 0) {
            iVar1 = Prs_ManErrorSet(p,"Cannot read digit in range specification.",0);
            return iVar1;
          }
          local_20 = atoi(p->pCur);
          while (iVar2 = Prs_ManIsDigit(p), iVar2 != 0) {
            p->pCur = p->pCur + 1;
          }
          iVar2 = Prs_ManUtilSkipSpaces(p);
          if (iVar2 != 0) {
            iVar1 = Prs_ManErrorSet(p,"Error number 6.",0);
            return iVar1;
          }
        }
        iVar2 = Prs_ManIsChar(p,']');
        if (iVar2 == 0) {
          p_local._4_4_ = Prs_ManErrorSet(p,"Cannot read closing brace in range specification.",0);
        }
        else {
          p->pCur = p->pCur + 1;
          iVar2 = Prs_ManUtilSkipSpaces(p);
          if (iVar2 == 0) {
            p_local._4_4_ = Hash_Int2ManInsert(p->vHash,iVar1,local_20,0);
          }
          else {
            p_local._4_4_ = Prs_ManErrorSet(p,"Error number 6a.",0);
          }
        }
      }
      else {
        p_local._4_4_ = Prs_ManErrorSet(p,"Error number 4.",0);
      }
    }
  }
  else {
    p_local._4_4_ = Prs_ManErrorSet(p,"Error number 3.",0);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Prs_ManReadRange( Prs_Man_t * p )
{
    int Left, Right;
    assert( Prs_ManIsChar(p, '[') );
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 3.", 0);
    if ( !Prs_ManIsDigit(p) )               return Prs_ManErrorSet(p, "Cannot read digit in range specification.", 0);
    Left = Right = atoi(p->pCur);
    while ( Prs_ManIsDigit(p) ) 
        p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 4.", 0);
    if ( Prs_ManIsChar(p, ':') )
    {
        p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 5.", 0);
        if ( !Prs_ManIsDigit(p) )           return Prs_ManErrorSet(p, "Cannot read digit in range specification.", 0);
        Right = atoi(p->pCur);
        while ( Prs_ManIsDigit(p) ) 
            p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 6.", 0);
    }
    if ( !Prs_ManIsChar(p, ']') )           return Prs_ManErrorSet(p, "Cannot read closing brace in range specification.", 0);
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 6a.", 0);
    return Hash_Int2ManInsert( p->vHash, Left, Right, 0 );
}